

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O1

xmlNanoHTTPCtxtPtr xmlNanoHTTPNewCtxt(char *URL)

{
  int iVar1;
  xmlNanoHTTPCtxtPtr __s;
  xmlURIPtr uri;
  char *pcVar2;
  size_t sVar3;
  xmlChar *pxVar4;
  
  __s = (xmlNanoHTTPCtxtPtr)(*xmlMalloc)(0xb0);
  if (__s == (xmlNanoHTTPCtxtPtr)0x0) {
    __xmlSimpleError(10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating context");
    return (xmlNanoHTTPCtxtPtr)0x0;
  }
  memset(__s,0,0xb0);
  __s->port = 0x50;
  __s->returnValue = 0;
  __s->fd = -1;
  __s->ContentLength = -1;
  if (__s->protocol != (char *)0x0) {
    (*xmlFree)(__s->protocol);
    __s->protocol = (char *)0x0;
  }
  if (__s->hostname != (char *)0x0) {
    (*xmlFree)(__s->hostname);
    __s->hostname = (char *)0x0;
  }
  if (__s->path != (char *)0x0) {
    (*xmlFree)(__s->path);
    __s->path = (char *)0x0;
  }
  if (__s->query != (char *)0x0) {
    (*xmlFree)(__s->query);
    __s->query = (char *)0x0;
  }
  uri = xmlParseURIRaw(URL,1);
  if (uri == (xmlURIPtr)0x0) {
    return __s;
  }
  if ((uri->scheme == (char *)0x0) || (uri->server == (char *)0x0)) goto LAB_00154b16;
  pcVar2 = (*xmlMemStrdup)(uri->scheme);
  __s->protocol = pcVar2;
  pcVar2 = uri->server;
  if ((pcVar2 == (char *)0x0) || (*pcVar2 != '[')) {
LAB_00154ad5:
    pxVar4 = (xmlChar *)(*xmlMemStrdup)(pcVar2);
  }
  else {
    sVar3 = strlen(pcVar2);
    iVar1 = (int)sVar3;
    if ((iVar1 < 3) || (pcVar2[iVar1 - 1] != ']')) goto LAB_00154ad5;
    pxVar4 = xmlCharStrndup(pcVar2 + 1,iVar1 + -2);
  }
  __s->hostname = (char *)pxVar4;
  pcVar2 = "/";
  if (uri->path != (char *)0x0) {
    pcVar2 = uri->path;
  }
  pcVar2 = (*xmlMemStrdup)(pcVar2);
  __s->path = pcVar2;
  if (uri->query != (char *)0x0) {
    pcVar2 = (*xmlMemStrdup)(uri->query);
    __s->query = pcVar2;
  }
  if (uri->port != 0) {
    __s->port = uri->port;
  }
LAB_00154b16:
  xmlFreeURI(uri);
  return __s;
}

Assistant:

static xmlNanoHTTPCtxtPtr
xmlNanoHTTPNewCtxt(const char *URL) {
    xmlNanoHTTPCtxtPtr ret;

    ret = (xmlNanoHTTPCtxtPtr) xmlMalloc(sizeof(xmlNanoHTTPCtxt));
    if (ret == NULL) {
        xmlHTTPErrMemory("allocating context");
        return(NULL);
    }

    memset(ret, 0, sizeof(xmlNanoHTTPCtxt));
    ret->port = 80;
    ret->returnValue = 0;
    ret->fd = INVALID_SOCKET;
    ret->ContentLength = -1;

    xmlNanoHTTPScanURL(ret, URL);

    return(ret);
}